

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::WriteTVaR
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int epcalc,int eptype_tvar,
          map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail)

{
  _Rb_tree_color _Var1;
  pointer pTVar2;
  int strLen;
  _Rb_tree_node_base *p_Var3;
  pointer pTVar4;
  pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_> s;
  char buffer [4096];
  vector<TVaR,_std::allocator<TVaR>_> local_1050;
  char local_1038 [4104];
  
  for (p_Var3 = (tail->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(tail->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    _Var1 = p_Var3[1]._M_color;
    std::vector<TVaR,_std::allocator<TVaR>_>::vector
              (&local_1050,(vector<TVaR,_std::allocator<TVaR>_> *)&p_Var3[1]._M_parent);
    pTVar2 = local_1050.super__Vector_base<TVaR,_std::allocator<TVaR>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar4 = local_1050.super__Vector_base<TVaR,_std::allocator<TVaR>_>._M_impl.
                  super__Vector_impl_data._M_start; pTVar4 != pTVar2; pTVar4 = pTVar4 + 1) {
      local_1038[0] = '\0';
      strLen = snprintf(local_1038,0x1000,"%d,%d,%d,%f,%f\n",pTVar4->retperiod,(double)pTVar4->tvar,
                        (ulong)_Var1,(ulong)(uint)epcalc,(ulong)(uint)eptype_tvar);
      OutputRows(this,fileIDs,local_1038,strLen);
    }
    if (local_1050.super__Vector_base<TVaR,_std::allocator<TVaR>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1050.super__Vector_base<TVaR,_std::allocator<TVaR>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void aggreports::WriteTVaR(const std::vector<int> &fileIDs, const int epcalc,
			   const int eptype_tvar,
			   const std::map<int, std::vector<TVaR>> &tail) {

  const int bufferSize = 4096;
  char buffer[bufferSize];
  int strLen;

  for (auto s : tail) {
    for (auto t : s.second) {
      buffer[0] = 0;
      strLen = snprintf(buffer, bufferSize, "%d,%d,%d,%f,%f\n", s.first,
			epcalc, eptype_tvar, t.retperiod, t.tvar);
      OutputRows(fileIDs, buffer, strLen);
    }
  }

}